

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  xmlChar xVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  uint uVar4;
  int iVar5;
  byte *str;
  byte *pbVar6;
  long lVar7;
  xmlChar *pxVar8;
  int iVar9;
  xmlParserErrors error;
  int iVar10;
  int iVar11;
  int l;
  int local_58;
  uint local_54;
  byte *local_50;
  int local_44;
  xmlParserInputPtr local_40;
  xmlChar **local_38;
  
  iVar9 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    iVar9 = 10000000;
  }
  local_50 = (byte *)0x0;
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '\"') {
    local_54 = 0x22;
  }
  else {
    if (xVar1 != '\'') {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    local_54 = 0x27;
  }
  str = (byte *)(*xmlMallocAtomic)(100);
  if (str == (byte *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ENTITY_VALUE;
  local_40 = ctxt->input;
  if ((ctxt->progressive == 0) && ((long)local_40->end - (long)local_40->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar8 = (xmlChar *)0x0;
  if (ctxt->instate != XML_PARSER_EOF) {
    local_38 = orig;
    xmlNextChar(ctxt);
    uVar4 = xmlCurrentChar(ctxt,&local_58);
    iVar11 = 100;
    iVar10 = 0;
    local_44 = iVar9;
    do {
      if ((int)uVar4 < 0x100) {
        if ((0x1f < (int)uVar4) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0))))
        goto LAB_00158df6;
LAB_00158f62:
        str[iVar10] = 0;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_00159035;
        if (uVar4 != local_54) {
          error = XML_ERR_ENTITY_NOT_FINISHED;
          goto LAB_00159011;
        }
        xmlNextChar(ctxt);
        local_50 = str;
        goto LAB_00158f9a;
      }
      if ((0xfffff < uVar4 - 0x10000 && 0x1ffd < uVar4 - 0xe000) && 0xd7ff < (int)uVar4)
      goto LAB_00158f62;
LAB_00158df6:
      if (((uVar4 == local_54) && (ctxt->input == local_40)) || (ctxt->instate == XML_PARSER_EOF))
      goto LAB_00158f62;
      pbVar6 = str;
      if (iVar11 <= iVar10 + 5) {
        iVar11 = iVar11 * 2;
        pbVar6 = (byte *)(*xmlRealloc)(str,(long)iVar11);
        iVar9 = local_44;
        if (pbVar6 == (byte *)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          goto LAB_00159035;
        }
      }
      str = pbVar6;
      if (local_58 == 1) {
        lVar7 = (long)iVar10;
        iVar10 = iVar10 + 1;
        str[lVar7] = (byte)uVar4;
      }
      else {
        iVar5 = xmlCopyCharMultiByte(str + iVar10,uVar4);
        iVar10 = iVar5 + iVar10;
      }
      pxVar3 = ctxt->input;
      if (*pxVar3->cur == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      pxVar8 = pxVar3->cur + local_58;
      pxVar3->cur = pxVar8;
      if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar8 < 0xfa)) {
        xmlGROW(ctxt);
      }
      uVar4 = xmlCurrentChar(ctxt,&local_58);
      if (uVar4 == 0) {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        uVar4 = xmlCurrentChar(ctxt,&local_58);
      }
    } while (iVar10 <= iVar9);
    xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_NOT_FINISHED,"entity value too long\n");
LAB_00159035:
    pxVar8 = (xmlChar *)0x0;
  }
LAB_00159038:
  if (str != (byte *)0x0) {
    (*xmlFree)(str);
  }
  return pxVar8;
LAB_00158f9a:
  bVar2 = *local_50;
  uVar4 = (uint)bVar2;
  if (bVar2 == 0x25) {
LAB_00158fbb:
    local_50 = local_50 + 1;
    pxVar8 = xmlParseStringName(ctxt,&local_50);
    if ((pxVar8 == (xmlChar *)0x0) || ((*xmlFree)(pxVar8), *local_50 != 0x3b)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",uVar4);
      goto LAB_00159035;
    }
    if ((uVar4 == 0x25) && ((ctxt->inSubset == 1 && (ctxt->inputNr == 1)))) {
      error = XML_ERR_ENTITY_PE_INTERNAL;
LAB_00159011:
      pxVar8 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,error,(char *)0x0);
      goto LAB_00159038;
    }
  }
  else if (bVar2 == 0x26) {
    if (local_50[1] != 0x23) goto LAB_00158fbb;
  }
  else if (uVar4 == 0) goto LAB_0015905b;
  local_50 = local_50 + 1;
  goto LAB_00158f9a;
LAB_0015905b:
  ctxt->depth = ctxt->depth + 1;
  pxVar8 = xmlStringDecodeEntities(ctxt,str,2,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  if (local_38 != (xmlChar **)0x0) {
    *local_38 = str;
    str = (byte *)0x0;
  }
  goto LAB_00159038;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
                           "entity value too long\n");
            goto error;
        }
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}